

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elements.c
# Opt level: O2

int get_nonce_hash(uchar *pub_key,size_t pub_key_len,uchar *priv_key,size_t priv_key_len,
                  uchar *bytes_out,size_t len)

{
  int iVar1;
  uchar nonce [32];
  
  iVar1 = wally_ecdh(pub_key,pub_key_len,priv_key,priv_key_len,nonce,0x20);
  if (iVar1 == 0) {
    iVar1 = wally_sha256(nonce,0x20,bytes_out,0x20);
  }
  wally_clear(nonce,0x20);
  return iVar1;
}

Assistant:

static int get_nonce_hash(const unsigned char *pub_key, size_t pub_key_len,
                          const unsigned char *priv_key, size_t priv_key_len,
                          unsigned char *bytes_out, size_t len)
{
    unsigned char nonce[SHA256_LEN];
    int ret;

    ret = wally_ecdh(pub_key, pub_key_len, priv_key, priv_key_len,
                     nonce, sizeof(nonce));
    if (ret == WALLY_OK)
        ret = wally_sha256(nonce, sizeof(nonce), bytes_out, len);
    wally_clear(nonce, sizeof(nonce));
    return ret;
}